

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_embedded.cpp
# Opt level: O0

Ref trun::DynLibEmbedded::Create(void)

{
  element_type *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ref RVar1;
  shared_ptr<trun::DynLibEmbedded> *ref;
  
  std::make_shared<trun::DynLibEmbedded>();
  this = std::__shared_ptr_access<trun::DynLibEmbedded,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<trun::DynLibEmbedded,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_RDI);
  IDynLibrary::SetVersion(&this->super_IDynLibrary,0x474e4b5f30323030);
  RVar1.super___shared_ptr<trun::DynLibEmbedded,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar1.super___shared_ptr<trun::DynLibEmbedded,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ref)RVar1.super___shared_ptr<trun::DynLibEmbedded,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DynLibEmbedded::Ref DynLibEmbedded::Create() {
    auto ref =  std::make_shared<DynLibEmbedded>();
#ifdef TRUN_USE_V1
#else
    ref->SetVersion(STR_TO_VER("GNK_0200"));
#endif
    return ref;
}